

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O0

void __thiscall Symbol::Symbol(Symbol *this,string *str)

{
  string *str_local;
  Symbol *this_local;
  
  Atom::Atom(&this->super_Atom);
  (this->super_Atom)._vptr_Atom = (_func_int **)&PTR__Symbol_00112c38;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::operator=((string *)&this->name,(string *)str);
  return;
}

Assistant:

Symbol::Symbol(const std::string &str) {
    name = str;
}